

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::PopItemFlag(void)

{
  ImGuiWindow *pIVar1;
  uint uVar2;
  int iVar3;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  iVar3 = (pIVar1->DC).ItemFlagsStack.Size;
  if (0 < iVar3) {
    uVar2 = iVar3 - 1;
    (pIVar1->DC).ItemFlagsStack.Size = uVar2;
    if (uVar2 == 0) {
      iVar3 = 1;
    }
    else {
      iVar3 = (pIVar1->DC).ItemFlagsStack.Data[(ulong)uVar2 - 1];
    }
    (pIVar1->DC).ItemFlags = iVar3;
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                ,0x4e1,"void ImVector<int>::pop_back() [T = int]");
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }